

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageSorters.h
# Opt level: O0

bool FIX::header_order::compare(int x,int y)

{
  int iVar1;
  int iVar2;
  int orderedY;
  int orderedX;
  int y_local;
  int x_local;
  
  iVar1 = getOrderedPosition(x);
  iVar2 = getOrderedPosition(y);
  if ((iVar1 == 0) || (iVar2 == 0)) {
    if (iVar1 == 0) {
      if (iVar2 == 0) {
        y_local._3_1_ = x < y;
      }
      else {
        y_local._3_1_ = false;
      }
    }
    else {
      y_local._3_1_ = true;
    }
  }
  else {
    y_local._3_1_ = iVar1 < iVar2;
  }
  return y_local._3_1_;
}

Assistant:

static bool compare(const int x, const int y) {
    int orderedX = getOrderedPosition(x);
    int orderedY = getOrderedPosition(y);

    if (orderedX && orderedY) {
      return orderedX < orderedY;
    } else if (orderedX) {
      return true;
    } else if (orderedY) {
      return false;
    } else {
      return x < y;
    }
  }